

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::GeneratedCodeInfo::MergeFrom(GeneratedCodeInfo *this,GeneratedCodeInfo *from)

{
  void *pvVar1;
  Rep *pRVar2;
  void **our_elems;
  int iVar3;
  
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  iVar3 = (from->annotation_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar3 != 0) {
    pRVar2 = (from->annotation_).super_RepeatedPtrFieldBase.rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->annotation_).super_RepeatedPtrFieldBase,iVar3);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::TypeHandler>
              (&(this->annotation_).super_RepeatedPtrFieldBase,our_elems,pRVar2->elements,iVar3,
               ((this->annotation_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->annotation_).super_RepeatedPtrFieldBase.current_size_);
    iVar3 = iVar3 + (this->annotation_).super_RepeatedPtrFieldBase.current_size_;
    (this->annotation_).super_RepeatedPtrFieldBase.current_size_ = iVar3;
    pRVar2 = (this->annotation_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar2->allocated_size < iVar3) {
      pRVar2->allocated_size = iVar3;
    }
  }
  return;
}

Assistant:

void GeneratedCodeInfo::MergeFrom(const GeneratedCodeInfo& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.GeneratedCodeInfo)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  annotation_.MergeFrom(from.annotation_);
}